

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool AddLocal(CNetAddr *addr,int nScore)

{
  bool bVar1;
  CNetAddr *in_RDI;
  long in_FS_OFFSET;
  CService *in_stack_00000018;
  int in_stack_00000064;
  undefined6 in_stack_ffffffffffffff98;
  uint16_t in_stack_ffffffffffffff9e;
  CService local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetListenPort();
  CService::CService(&local_30,in_RDI,in_stack_ffffffffffffff9e);
  bVar1 = AddLocal(in_stack_00000018,in_stack_00000064);
  CService::~CService((CService *)CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AddLocal(const CNetAddr &addr, int nScore)
{
    return AddLocal(CService(addr, GetListenPort()), nScore);
}